

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3PoslistPhraseMerge(char **pp,int nToken,int isSaveLeft,int isExact,char **pp1,char **pp2)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uchar *q;
  byte *pbVar9;
  byte *pbVar10;
  byte *pbVar11;
  long lVar12;
  long lVar13;
  char *pEnd_1;
  byte *pbVar14;
  char *pEnd;
  byte *p;
  long lVar15;
  int iCol2;
  int iCol1;
  sqlite3_int64 iVal;
  int local_78;
  int local_74;
  long local_70;
  int local_68;
  int local_64;
  byte *local_60;
  long local_58;
  char **local_50;
  char **local_48;
  char **local_40;
  long local_38;
  
  pbVar11 = (byte *)*pp;
  pbVar14 = (byte *)*pp1;
  p = (byte *)*pp2;
  local_74 = 0;
  local_78 = 0;
  local_68 = isSaveLeft;
  local_64 = isExact;
  local_50 = pp1;
  local_48 = pp2;
  local_40 = pp;
  if (*pbVar14 == 1) {
    if ((char)pbVar14[1] < '\0') {
      uVar4 = sqlite3Fts3GetVarint32((char *)(pbVar14 + 1),&local_74);
      uVar6 = (ulong)uVar4;
    }
    else {
      uVar6 = 1;
      local_74 = (int)(char)pbVar14[1];
    }
    pbVar14 = pbVar14 + 1 + uVar6;
  }
  if (*p == 1) {
    if ((char)p[1] < '\0') {
      uVar4 = sqlite3Fts3GetVarint32((char *)(p + 1),&local_78);
      uVar6 = (ulong)uVar4;
    }
    else {
      uVar6 = 1;
      local_78 = (int)(char)p[1];
    }
    p = p + 1 + uVar6;
  }
  local_38 = (long)nToken;
  iVar5 = local_74;
  do {
    while (iVar5 != local_78) {
      if (iVar5 < local_78) {
        bVar2 = *pbVar14;
        if (1 < bVar2) {
          do {
            bVar3 = bVar2 & 0x80;
            bVar2 = pbVar14[1];
            pbVar14 = pbVar14 + 1;
          } while ((bVar2 & 0xfe) != 0 || bVar3 != 0);
        }
        if (*pbVar14 == 0) goto LAB_00181c64;
        if ((char)pbVar14[1] < '\0') {
          uVar4 = sqlite3Fts3GetVarint32((char *)(pbVar14 + 1),&local_74);
          uVar6 = (ulong)uVar4;
        }
        else {
          uVar6 = 1;
          local_74 = (int)(char)pbVar14[1];
        }
        pbVar14 = pbVar14 + 1 + uVar6;
        iVar5 = local_74;
      }
      else {
        bVar2 = *p;
        if (1 < bVar2) {
          do {
            bVar3 = bVar2 & 0x80;
            bVar2 = p[1];
            p = p + 1;
          } while ((bVar2 & 0xfe) != 0 || bVar3 != 0);
        }
        if (*p == 0) goto LAB_00181c64;
        if ((char)p[1] < '\0') {
          uVar4 = sqlite3Fts3GetVarint32((char *)(p + 1),&local_78);
          uVar6 = (ulong)uVar4;
        }
        else {
          uVar6 = 1;
          local_78 = (int)(char)p[1];
        }
        p = p + 1 + uVar6;
      }
    }
    pbVar10 = pbVar11;
    if (iVar5 != 0) {
      *pbVar11 = 1;
      uVar6 = (long)local_74;
      pbVar10 = pbVar11 + 1;
      do {
        pbVar9 = pbVar10;
        bVar2 = (byte)uVar6;
        *pbVar9 = bVar2 | 0x80;
        pbVar10 = pbVar9 + 1;
        bVar1 = 0x7f < uVar6;
        uVar6 = uVar6 >> 7;
      } while (bVar1);
      *pbVar9 = bVar2;
    }
    local_60 = pbVar11;
    iVar5 = sqlite3Fts3GetVarint((char *)pbVar14,&local_70);
    lVar13 = local_70;
    pbVar14 = pbVar14 + iVar5;
    iVar5 = sqlite3Fts3GetVarint((char *)p,&local_70);
    p = p + iVar5;
    lVar12 = local_70 + -2;
    lVar7 = 0;
    while( true ) {
      local_58 = lVar13 + -2;
      lVar13 = local_58 + local_38;
      while( true ) {
        if ((lVar12 == lVar13) || (((lVar12 <= lVar13 && (local_64 == 0)) && (local_58 < lVar12))))
        {
          lVar15 = local_58;
          if (local_68 == 0) {
            lVar15 = lVar12;
          }
          uVar6 = (lVar15 - lVar7) + 2;
          do {
            pbVar11 = pbVar10;
            bVar2 = (byte)uVar6;
            *pbVar11 = bVar2 | 0x80;
            pbVar10 = pbVar11 + 1;
            bVar1 = 0x7f < uVar6;
            uVar6 = uVar6 >> 7;
          } while (bVar1);
          *pbVar11 = bVar2;
          local_60 = (byte *)0x0;
          lVar7 = lVar15;
        }
        if ((local_58 < lVar12) && (local_68 != 0 || lVar13 < lVar12)) break;
        if (*p < 2) goto LAB_00181b9d;
        iVar5 = sqlite3Fts3GetVarint((char *)p,&local_70);
        p = p + iVar5;
        lVar12 = lVar12 + local_70 + -2;
      }
      if (*pbVar14 < 2) break;
      iVar5 = sqlite3Fts3GetVarint((char *)pbVar14,&local_70);
      pbVar14 = pbVar14 + iVar5;
      lVar13 = local_58 + local_70;
    }
LAB_00181b9d:
    pbVar11 = pbVar10;
    if (local_60 != (byte *)0x0) {
      pbVar11 = local_60;
    }
    bVar2 = *pbVar14;
    if (1 < bVar2) {
      do {
        bVar3 = bVar2 & 0x80;
        bVar2 = pbVar14[1];
        pbVar14 = pbVar14 + 1;
      } while ((bVar2 & 0xfe) != 0 || bVar3 != 0);
    }
    bVar2 = *p;
    if (1 < bVar2) {
      do {
        bVar3 = bVar2 & 0x80;
        bVar2 = p[1];
        p = p + 1;
      } while ((bVar2 & 0xfe) != 0 || bVar3 != 0);
    }
    if ((*pbVar14 == 0) || (*p == 0)) {
      bVar1 = false;
    }
    else {
      if ((char)pbVar14[1] < '\0') {
        uVar4 = sqlite3Fts3GetVarint32((char *)(pbVar14 + 1),&local_74);
        uVar6 = (ulong)uVar4;
      }
      else {
        uVar6 = 1;
        local_74 = (int)(char)pbVar14[1];
      }
      if ((char)p[1] < '\0') {
        uVar4 = sqlite3Fts3GetVarint32((char *)(p + 1),&local_78);
        uVar8 = (ulong)uVar4;
      }
      else {
        uVar8 = 1;
        local_78 = (int)(char)p[1];
      }
      pbVar14 = pbVar14 + 1 + uVar6;
      p = p + 1 + uVar8;
      bVar1 = true;
    }
    iVar5 = local_74;
  } while (bVar1);
LAB_00181c64:
  bVar2 = *p;
  if (*p != 0) {
    do {
      pbVar10 = p + 1;
      p = p + 1;
      bVar3 = bVar2 & 0x80;
      bVar2 = *pbVar10;
    } while (bVar3 != 0 || *pbVar10 != 0);
  }
  bVar2 = *pbVar14;
  if (*pbVar14 != 0) {
    do {
      pbVar10 = pbVar14 + 1;
      pbVar14 = pbVar14 + 1;
      bVar3 = bVar2 & 0x80;
      bVar2 = *pbVar10;
    } while (bVar3 != 0 || *pbVar10 != 0);
  }
  *local_50 = (char *)(pbVar14 + 1);
  *local_48 = (char *)(p + 1);
  pbVar14 = (byte *)*local_40;
  if (pbVar14 != pbVar11) {
    *pbVar11 = 0;
    *local_40 = (char *)(pbVar11 + 1);
  }
  return (uint)(pbVar14 != pbVar11);
}

Assistant:

static int fts3PoslistPhraseMerge(
  char **pp,                      /* IN/OUT: Preallocated output buffer */
  int nToken,                     /* Maximum difference in token positions */
  int isSaveLeft,                 /* Save the left position */
  int isExact,                    /* If *pp1 is exactly nTokens before *pp2 */
  char **pp1,                     /* IN/OUT: Left input list */
  char **pp2                      /* IN/OUT: Right input list */
){
  char *p = *pp;
  char *p1 = *pp1;
  char *p2 = *pp2;
  int iCol1 = 0;
  int iCol2 = 0;

  /* Never set both isSaveLeft and isExact for the same invocation. */
  assert( isSaveLeft==0 || isExact==0 );

  assert( p!=0 && *p1!=0 && *p2!=0 );
  if( *p1==POS_COLUMN ){ 
    p1++;
    p1 += fts3GetVarint32(p1, &iCol1);
  }
  if( *p2==POS_COLUMN ){ 
    p2++;
    p2 += fts3GetVarint32(p2, &iCol2);
  }

  while( 1 ){
    if( iCol1==iCol2 ){
      char *pSave = p;
      sqlite3_int64 iPrev = 0;
      sqlite3_int64 iPos1 = 0;
      sqlite3_int64 iPos2 = 0;

      if( iCol1 ){
        *p++ = POS_COLUMN;
        p += sqlite3Fts3PutVarint(p, iCol1);
      }

      assert( *p1!=POS_END && *p1!=POS_COLUMN );
      assert( *p2!=POS_END && *p2!=POS_COLUMN );
      fts3GetDeltaVarint(&p1, &iPos1); iPos1 -= 2;
      fts3GetDeltaVarint(&p2, &iPos2); iPos2 -= 2;

      while( 1 ){
        if( iPos2==iPos1+nToken 
         || (isExact==0 && iPos2>iPos1 && iPos2<=iPos1+nToken) 
        ){
          sqlite3_int64 iSave;
          iSave = isSaveLeft ? iPos1 : iPos2;
          fts3PutDeltaVarint(&p, &iPrev, iSave+2); iPrev -= 2;
          pSave = 0;
          assert( p );
        }
        if( (!isSaveLeft && iPos2<=(iPos1+nToken)) || iPos2<=iPos1 ){
          if( (*p2&0xFE)==0 ) break;
          fts3GetDeltaVarint(&p2, &iPos2); iPos2 -= 2;
        }else{
          if( (*p1&0xFE)==0 ) break;
          fts3GetDeltaVarint(&p1, &iPos1); iPos1 -= 2;
        }
      }

      if( pSave ){
        assert( pp && p );
        p = pSave;
      }

      fts3ColumnlistCopy(0, &p1);
      fts3ColumnlistCopy(0, &p2);
      assert( (*p1&0xFE)==0 && (*p2&0xFE)==0 );
      if( 0==*p1 || 0==*p2 ) break;

      p1++;
      p1 += fts3GetVarint32(p1, &iCol1);
      p2++;
      p2 += fts3GetVarint32(p2, &iCol2);
    }

    /* Advance pointer p1 or p2 (whichever corresponds to the smaller of
    ** iCol1 and iCol2) so that it points to either the 0x00 that marks the
    ** end of the position list, or the 0x01 that precedes the next 
    ** column-number in the position list. 
    */
    else if( iCol1<iCol2 ){
      fts3ColumnlistCopy(0, &p1);
      if( 0==*p1 ) break;
      p1++;
      p1 += fts3GetVarint32(p1, &iCol1);
    }else{
      fts3ColumnlistCopy(0, &p2);
      if( 0==*p2 ) break;
      p2++;
      p2 += fts3GetVarint32(p2, &iCol2);
    }
  }

  fts3PoslistCopy(0, &p2);
  fts3PoslistCopy(0, &p1);
  *pp1 = p1;
  *pp2 = p2;
  if( *pp==p ){
    return 0;
  }
  *p++ = 0x00;
  *pp = p;
  return 1;
}